

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::setHeader(QTreeView *this,QHeaderView *header)

{
  QAbstractItemViewPrivate *this_00;
  QHeaderView *pQVar1;
  void **ppvVar2;
  undefined8 uVar3;
  long *plVar4;
  Data *pDVar5;
  QAbstractItemModel *pQVar6;
  undefined4 *puVar7;
  QObject *pQVar8;
  unsigned_long __i0;
  long lVar9;
  long in_FS_OFFSET;
  QSlotObjectBase local_c0;
  code *local_b0;
  ImplFn local_a8;
  code *local_a0;
  ImplFn local_98;
  code *local_90;
  ImplFn local_88;
  code *local_80;
  ImplFn local_78;
  code *local_70;
  undefined8 local_68;
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = *(QHeaderView **)
            &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
             field_0x50;
  if (header != (QHeaderView *)0x0 && pQVar1 != header) {
    if ((pQVar1 != (QHeaderView *)0x0) &&
       (*(QTreeView **)
         (*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8 + 0x10) == this)) {
      (**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.
                             super_QFrame.super_QWidget + 0x20))();
    }
    *(QHeaderView **)
     &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
      field_0x50 = header;
    QWidget::setParent((QWidget *)header,(QWidget *)this);
    lVar9 = 0;
    QHeaderView::setFirstSectionMovable
              (*(QHeaderView **)
                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                 super_QWidgetPrivate.field_0x50,false);
    pQVar6 = QAbstractItemView::model
                       (*(QAbstractItemView **)
                         &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                          super_QWidgetPrivate.field_0x50);
    if (pQVar6 == (QAbstractItemModel *)0x0) {
      plVar4 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                          super_QWidgetPrivate.field_0x50;
      (**(code **)(*plVar4 + 0x1c8))(plVar4,this_00->model);
      pDVar5 = (this_00->selectionModel).wp.d;
      if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
         ((this_00->selectionModel).wp.value != (QObject *)0x0)) {
        plVar4 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x50;
        if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
          pQVar8 = (QObject *)0x0;
        }
        else {
          pQVar8 = (this_00->selectionModel).wp.value;
        }
        (**(code **)(*plVar4 + 0x1d0))(plVar4,pQVar8);
      }
    }
    ppvVar2 = *(void ***)
               &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .field_0x50;
    local_80 = columnResized;
    local_78 = (ImplFn)0x0;
    local_70 = QHeaderView::sectionResized;
    local_68 = 0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::
         QCallableObject<void_(QTreeView::*)(int,_int,_int),_QtPrivate::List<int,_int,_int>,_void>::
         impl;
    *(code **)(puVar7 + 4) = columnResized;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_60,ppvVar2,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)&local_80,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    ppvVar2 = *(void ***)
               &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .field_0x50;
    local_90 = columnMoved;
    local_88 = (ImplFn)0x0;
    local_70 = QHeaderView::sectionMoved;
    local_68 = 0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QCallableObject<void_(QTreeView::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = columnMoved;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_58,ppvVar2,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)&local_90,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    ppvVar2 = *(void ***)
               &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .field_0x50;
    local_a0 = columnCountChanged;
    local_98 = (ImplFn)0x0;
    local_70 = QHeaderView::sectionCountChanged;
    local_68 = 0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QCallableObject<void_(QTreeView::*)(int,_int),_QtPrivate::List<int,_int>,_void>
         ::impl;
    *(code **)(puVar7 + 4) = columnCountChanged;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_50,ppvVar2,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)&local_a0,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    ppvVar2 = *(void ***)
               &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .field_0x50;
    local_b0 = resizeColumnToContents;
    local_a8 = (ImplFn)0x0;
    local_70 = QHeaderView::sectionHandleDoubleClicked;
    local_68 = 0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QCallableObject<void_(QTreeView::*)(int),_QtPrivate::List<int>,_void>::impl;
    *(code **)(puVar7 + 4) = resizeColumnToContents;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_48,ppvVar2,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)&local_b0,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    ppvVar2 = *(void ***)
               &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .field_0x50;
    local_c0.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x269;
    local_c0._4_4_ = 0;
    local_c0.m_impl = (ImplFn)0x0;
    local_70 = QHeaderView::geometriesChanged;
    local_68 = 0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QCallableObject<void_(QTreeView::*)(),_QtPrivate::List<>,_void>::impl;
    *(undefined8 *)(puVar7 + 4) = 0x269;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_40,ppvVar2,(QObject *)&local_70,(void **)this,&local_c0,(ConnectionType)puVar7,
               (int *)0x0,(QMetaObject *)0x0);
    do {
      uVar3 = (&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .statusTip.d.ptr)[lVar9];
      (&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
        statusTip.d.ptr)[lVar9] = (char16_t *)*(undefined8 *)(local_58 + lVar9 * 8 + -8);
      *(undefined8 *)(local_58 + lVar9 * 8 + -8) = uVar3;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 5);
    lVar9 = 0x20;
    do {
      QMetaObject::Connection::~Connection((Connection *)(local_58 + lVar9 + -8));
      lVar9 = lVar9 + -8;
    } while (lVar9 != -8);
    setSortingEnabled(this,*(bool *)((long)&this_00[1].super_QAbstractScrollAreaPrivate.
                                            super_QFramePrivate.super_QWidgetPrivate.focus_next + 3)
                     );
    QAbstractItemViewPrivate::updateGeometry(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setHeader(QHeaderView *header)
{
    Q_D(QTreeView);
    if (header == d->header || !header)
        return;
    if (d->header && d->header->parent() == this)
        delete d->header;
    d->header = header;
    d->header->setParent(this);
    d->header->setFirstSectionMovable(false);

    if (!d->header->model()) {
        d->header->setModel(d->model);
        if (d->selectionModel)
            d->header->setSelectionModel(d->selectionModel);
    }

    d->headerConnections = {
        connect(d->header, &QHeaderView::sectionResized,
                this, &QTreeView::columnResized),
        connect(d->header, &QHeaderView::sectionMoved,
                this, &QTreeView::columnMoved),
        connect(d->header, &QHeaderView::sectionCountChanged,
                this, &QTreeView::columnCountChanged),
        connect(d->header, &QHeaderView::sectionHandleDoubleClicked,
                this, &QTreeView::resizeColumnToContents),
        connect(d->header, &QHeaderView::geometriesChanged,
                this, &QTreeView::updateGeometries)
    };

    setSortingEnabled(d->sortingEnabled);
    d->updateGeometry();
}